

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O3

Int __thiscall ipx::Control::InterruptCheck(Control *this,Int ipm_iteration_count)

{
  double dVar1;
  HighsCallback *pHVar2;
  bool bVar3;
  undefined8 *puVar4;
  double dVar5;
  string local_38;
  
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  puVar4 = (undefined8 *)__tls_get_addr(&PTR_00441ef0);
  HighsSplitDeque::checkInterrupt((HighsSplitDeque *)*puVar4);
  dVar1 = (this->parameters_).super_ipx_parameters.time_limit;
  if ((0.0 <= dVar1) && (dVar5 = Timer::Elapsed(&this->timer_), dVar1 < dVar5)) {
    return 999;
  }
  pHVar2 = this->callback_;
  if (((pHVar2 != (HighsCallback *)0x0) &&
      ((pHVar2->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     ((*(pHVar2->active).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_p & 4) != 0)) {
    HighsCallback::clearHighsCallbackDataOut(pHVar2);
    pHVar2 = this->callback_;
    (pHVar2->data_out).ipm_iteration_count = ipm_iteration_count;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"IPM interrupt","");
    bVar3 = HighsCallback::callbackAction(pHVar2,2,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (bVar3) {
      return 0x3e6;
    }
  }
  return 0;
}

Assistant:

Int Control::InterruptCheck(const Int ipm_iteration_count) const {
    HighsTaskExecutor::getThisWorkerDeque()->checkInterrupt();
    if (parameters_.time_limit >= 0.0 &&
        parameters_.time_limit < timer_.Elapsed())
        return IPX_ERROR_time_interrupt;
    // The pointer callback_ should not be null, since that indicates
    // that it's not been set
    assert(callback_);
    if (callback_) {
      if (callback_->user_callback && callback_->active[kCallbackIpmInterrupt]) {
	callback_->clearHighsCallbackDataOut();
	callback_->data_out.ipm_iteration_count = ipm_iteration_count;
	if (callback_->callbackAction(kCallbackIpmInterrupt,
				      "IPM interrupt"))
	  return IPX_ERROR_user_interrupt;
      }
    }
    return 0;
}